

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::VsidsScore>(VsidsScore *first,VsidsScore *last,VsidsScore *x)

{
  double dVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      dVar1 = x->value;
      first->value = dVar1;
      first = first + 1;
LAB_0018d2ae:
      first->value = dVar1;
      first = first + 1;
switchD_0018d289_caseD_6:
      dVar1 = x->value;
      first->value = dVar1;
      first = first + 1;
LAB_0018d2bf:
      first->value = dVar1;
      first = first + 1;
switchD_0018d289_caseD_4:
      dVar1 = x->value;
      first->value = dVar1;
      first = first + 1;
LAB_0018d2d0:
      first->value = dVar1;
      first = first + 1;
switchD_0018d289_caseD_2:
      dVar1 = x->value;
      first->value = dVar1;
      first = first + 1;
LAB_0018d2e1:
      first->value = dVar1;
    }
    break;
  case 1:
    dVar1 = x->value;
    goto LAB_0018d2e1;
  case 2:
    goto switchD_0018d289_caseD_2;
  case 3:
    dVar1 = x->value;
    goto LAB_0018d2d0;
  case 4:
    goto switchD_0018d289_caseD_4;
  case 5:
    dVar1 = x->value;
    goto LAB_0018d2bf;
  case 6:
    goto switchD_0018d289_caseD_6;
  case 7:
    dVar1 = x->value;
    goto LAB_0018d2ae;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}